

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
SBarInfoCommandFlowControl::Tick
          (SBarInfoCommandFlowControl *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  uint uVar1;
  SBarInfoCommand **ppSVar2;
  long *plVar3;
  long lVar4;
  
  ppSVar2 = this->commands[this->truth].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
  uVar1 = this->commands[this->truth].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  for (lVar4 = 0; (ulong)uVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    plVar3 = *(long **)((long)ppSVar2 + lVar4);
    (**(code **)(*plVar3 + 0x28))(plVar3,block,statusBar,hudChanged);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			for(auto command : commands[truth])
				command->Tick(block, statusBar, hudChanged);
		}